

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_fut.cc
# Opt level: O3

int main(void)

{
  int iVar1;
  future<int> fut;
  ThreadPool t;
  future<int> fStack_c8;
  undefined4 local_b8;
  int local_b4;
  ThreadPool local_b0 [168];
  
  ThreadPool::ThreadPool(local_b0,true);
  local_b4 = 10;
  local_b8 = 0x16;
  ThreadPool::submit<int(&)(int,int),int,int>
            ((ThreadPool *)&fStack_c8,(_func_int_int_int *)local_b0,(int *)sum,&local_b4);
  iVar1 = std::future<int>::get(&fStack_c8);
  if (iVar1 == 0x20) {
    if (fStack_c8.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (fStack_c8.super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    WorkItemScheduler::~WorkItemScheduler((WorkItemScheduler *)local_b0);
    return 0;
  }
  __assert_fail("fut.get() == sum(a, b)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Hellzy[P]cpp-threadpool/tests/basic_fut.cc"
                ,0x12,"int main()");
}

Assistant:

int main()
{

    ThreadPool t;
    int a = 10;
    int b = 22;

    auto fut = t.submit(sum, 10, 22);
    assert(fut.get() == sum(a, b));

    return 0;
}